

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O1

void __thiscall
duckdb::ARTKey::CreateARTKey<char_const*>
          (ARTKey *this,ArenaAllocator *allocator,ARTKey *key,char *value)

{
  uint uVar1;
  size_t sVar2;
  ARTKey AVar3;
  string_t value_00;
  undefined4 uStack_24;
  undefined8 uStack_20;
  
  sVar2 = strlen((char *)key);
  uVar1 = (uint)sVar2;
  if (uVar1 < 0xd) {
    uStack_20._4_4_ = 0;
    uStack_24 = 0;
    uStack_20._0_4_ = 0;
    uStack_20 = (ARTKey *)0x0;
    if (uVar1 != 0) {
      switchD_012dd528::default(&uStack_24,key,(ulong)(uVar1 & 0xf));
      uStack_20 = (ARTKey *)CONCAT44(uStack_20._4_4_,(undefined4)uStack_20);
    }
  }
  else {
    uStack_24 = (undefined4)key->len;
    uStack_20 = key;
  }
  value_00.value.pointer.ptr = value;
  value_00.value._0_8_ = uStack_20;
  AVar3 = CreateARTKey<duckdb::string_t>(this,(ArenaAllocator *)CONCAT44(uStack_24,uVar1),value_00);
  allocator->allocator = (Allocator *)AVar3.len;
  allocator->initial_capacity = (idx_t)AVar3.data;
  return;
}

Assistant:

void ARTKey::CreateARTKey(ArenaAllocator &allocator, ARTKey &key, const char *value) {
	ARTKey::CreateARTKey(allocator, key, string_t(value, UnsafeNumericCast<uint32_t>(strlen(value))));
}